

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O1

void asio::detail::executor_function::
     complete<asio::detail::binder1<fineftp::FtpServerImpl::acceptFtpSession(std::shared_ptr<fineftp::FtpSession>,std::error_code_const&)::__0,std::error_code>,std::allocator<void>>
               (impl_base *base,bool call)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined3 in_register_00000031;
  allocator<void> allocator;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_server_impl_cpp:135:29),_std::error_code>
  function;
  ptr p;
  allocator<void> local_59;
  undefined1 local_58 [32];
  error_category *peStack_38;
  ptr local_30;
  
  local_30.a = &local_59;
  local_58._0_8_ = base[1].complete_;
  local_58._8_8_ = base[2].complete_;
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)base[3].complete_;
  base[3].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
  base[2].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
  local_58._24_8_ = base[4].complete_;
  peStack_38 = (error_category *)base[5].complete_;
  local_58._16_8_ = this;
  local_30.v = base;
  local_30.p = (impl<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_server_impl_cpp:135:29),_std::error_code>,_std::allocator<void>_>
                *)base;
  impl<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/server_impl.cpp:135:29),_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_30);
  if (CONCAT31(in_register_00000031,call) != 0) {
    binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/server_impl.cpp:135:29),_std::error_code>
    ::operator()((binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_server_impl_cpp:135:29),_std::error_code>
                  *)local_58);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  impl<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/server_impl.cpp:135:29),_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_30);
  return;
}

Assistant:

static void complete(impl_base* base, bool call)
  {
    // Take ownership of the function object.
    impl<Function, Alloc>* i(static_cast<impl<Function, Alloc>*>(base));
    Alloc allocator(i->allocator_);
    typename impl<Function, Alloc>::ptr p = {
      detail::addressof(allocator), i, i };

    // Make a copy of the function so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the function may be the true owner of the memory
    // associated with the function. Consequently, a local copy of the function
    // is required to ensure that any owning sub-object remains valid until
    // after we have deallocated the memory here.
    Function function(ASIO_MOVE_CAST(Function)(i->function_));
    p.reset();

    // Make the upcall if required.
    if (call)
    {
      asio_handler_invoke_helpers::invoke(function, function);
    }
  }